

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_connect(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  unsigned_short *sasl;
  short sVar2;
  connectdata *pcVar3;
  char cVar4;
  int iVar5;
  CURLcode CVar6;
  uchar uVar7;
  connectdata *conn;
  char *value;
  size_t len;
  char *first;
  char *pcVar8;
  
  pcVar3 = data->conn;
  *done = false;
  Curl_conncontrol(pcVar3,0);
  (pcVar3->proto).smbc.send_buf = (char *)0x1d4c0;
  (pcVar3->proto).ftpc.pp.statemachine = pop3_statemachine;
  (pcVar3->proto).ftpc.pp.endofresp = pop3_endofresp;
  (pcVar3->proto).pop3c.preftype = '\a';
  sasl = &(pcVar3->proto).imapc.sasl.authmechs;
  Curl_sasl_init((SASL *)sasl,data,&saslpop3);
  Curl_pp_init(&(pcVar3->proto).ftpc.pp);
  first = pcVar3->options;
  if (first != (char *)0x0) {
    cVar4 = *first;
    while (pcVar8 = first, cVar4 != '\0') {
      while ((value = pcVar8 + 1, cVar4 != '\0' && (cVar4 != '='))) {
        pcVar8 = value;
        cVar4 = *value;
      }
      len = 0xffffffffffffffff;
      while ((cVar4 != '\0' && (cVar4 != ';'))) {
        pcVar1 = pcVar8 + 1;
        pcVar8 = pcVar8 + 1;
        len = len + 1;
        cVar4 = *pcVar1;
      }
      iVar5 = curl_strnequal(first,"AUTH=",5);
      if (iVar5 == 0) {
        CVar6 = CURLE_URL_MALFORMAT;
        goto LAB_0014bea6;
      }
      CVar6 = Curl_sasl_parse_url_auth_option((SASL *)sasl,value,len);
      if (CVar6 != CURLE_OK) {
        iVar5 = curl_strnequal(value,"+APOP",len);
        if (iVar5 == 0) goto LAB_0014bea6;
        (pcVar3->proto).pop3c.preftype = '\x02';
        *(undefined2 *)((long)&pcVar3->proto + 0xda) = 0;
      }
      first = pcVar8 + (*pcVar8 == ';');
      cVar4 = pcVar8[*pcVar8 == ';'];
    }
  }
  CVar6 = CURLE_OK;
LAB_0014bea6:
  if ((pcVar3->proto).pop3c.preftype != '\x02') {
    sVar2 = *(short *)((long)&pcVar3->proto + 0xda);
    uVar7 = '\0';
    if (sVar2 != 0) {
      uVar7 = (sVar2 == -0x21) * '\x03' + '\x04';
    }
    (pcVar3->proto).pop3c.preftype = uVar7;
  }
  if (CVar6 == CURLE_OK) {
    pcVar3 = data->conn;
    (pcVar3->proto).pop3c.state = POP3_SERVERGREET;
    CVar6 = Curl_pp_statemach(data,&(pcVar3->proto).ftpc.pp,false,false);
    *done = (pcVar3->proto).pop3c.state == POP3_STOP;
  }
  return CVar6;
}

Assistant:

static CURLcode pop3_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  PINGPONG_SETUP(pp, pop3_statemachine, pop3_endofresp);

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  Curl_sasl_init(&pop3c->sasl, data, &saslpop3);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  pop3_state(data, POP3_SERVERGREET);

  result = pop3_multi_statemach(data, done);

  return result;
}